

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.cxx
# Opt level: O0

void undo_cb(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  char *pcVar2;
  char local_818 [8];
  char filename [2048];
  void *param_1_local;
  Fl_Widget *param_0_local;
  
  if (0 < undo_current) {
    filename._2040_8_ = param_2;
    if (undo_current == undo_last) {
      pcVar2 = undo_filename(undo_current,local_818,0x800);
      write_file(pcVar2,0);
    }
    undo_suspend();
    pcVar2 = undo_filename(undo_current + -1,local_818,0x800);
    iVar1 = read_file(pcVar2,0);
    if (iVar1 == 0) {
      undo_resume();
    }
    else {
      undo_current = undo_current + -1;
      set_modflag((uint)(undo_current != undo_save));
      if (undo_current < 1) {
        Fl_Menu_Item::deactivate(Main_Menu + 0x19);
      }
      Fl_Menu_Item::activate(Main_Menu + 0x1a);
      undo_resume();
    }
  }
  return;
}

Assistant:

void undo_cb(Fl_Widget *, void *) {
  char	filename[FL_PATH_MAX];			// Undo checkpoint file

  if (undo_current <= 0) return;

  if (undo_current == undo_last) {
    write_file(undo_filename(undo_current, filename, sizeof(filename)));
  }

  undo_suspend();
  if (!read_file(undo_filename(undo_current - 1, filename, sizeof(filename)), 0)) {
    // Unable to read checkpoint file, don't undo...
    undo_resume();
    return;
  }

  undo_current --;

  // Update modified flag...
  set_modflag(undo_current != undo_save);

  // Update undo/redo menu items...
  if (undo_current <= 0) Main_Menu[UNDO_ITEM].deactivate();
  Main_Menu[REDO_ITEM].activate();
  undo_resume();
}